

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O3

void sx_mem_init_block_ptr(sx_mem_block *mem,void *data,int64_t size)

{
  mem->alloc = (sx_alloc *)0x0;
  mem->data = data;
  mem->size = size;
  mem->start_offset = 0;
  mem->align = 0;
  mem->refcount = 1;
  return;
}

Assistant:

void sx_mem_init_block_ptr(sx_mem_block* mem, void* data, int64_t size)
{
    mem->alloc = NULL;
    mem->data = data;
    mem->size = size;
    mem->start_offset = 0;
    mem->align = 0;
    mem->refcount = 1;
}